

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edition_unittest.pb.cc
# Opt level: O0

void edition_unittest::TestExtensionOrderings1::MergeImpl(MessageLite *to_msg,MessageLite *from_msg)

{
  uint uVar1;
  TestExtensionOrderings1 *this;
  TestExtensionOrderings1 **v1;
  TestExtensionOrderings1 **v2;
  char *failure_msg;
  LogMessage *pLVar2;
  uint32_t *puVar3;
  Arena *arena;
  string_view sVar4;
  MessageLite *local_a0;
  char *local_98;
  uint32_t cached_has_bits;
  LogMessage local_80;
  Voidify local_69;
  TestExtensionOrderings1 *local_68;
  Nullable<const_char_*> local_60;
  Nullable<const_char_*> absl_log_internal_check_op_result;
  TestExtensionOrderings1 *from;
  TestExtensionOrderings1 *_this;
  MessageLite *from_msg_local;
  MessageLite *to_msg_local;
  char *local_30;
  TestExtensionOrderings1 *local_28;
  MessageLite *local_20;
  char *local_18;
  anon_union_16_1_493b367e_for_TestExtensionOrderings1_5 *local_10;
  
  local_68 = (TestExtensionOrderings1 *)from_msg;
  absl_log_internal_check_op_result = (Nullable<const_char_*>)from_msg;
  from = (TestExtensionOrderings1 *)to_msg;
  _this = (TestExtensionOrderings1 *)from_msg;
  from_msg_local = to_msg;
  v1 = absl::lts_20250127::log_internal::
       GetReferenceableValue<edition_unittest::TestExtensionOrderings1_const*>(&local_68);
  v2 = absl::lts_20250127::log_internal::
       GetReferenceableValue<edition_unittest::TestExtensionOrderings1*>(&from);
  local_60 = absl::lts_20250127::log_internal::
             Check_NEImpl<edition_unittest::TestExtensionOrderings1_const*,edition_unittest::TestExtensionOrderings1*>
                       (v1,v2,"&from != _this");
  if (local_60 != (Nullable<const_char_*>)0x0) {
    failure_msg = absl::lts_20250127::implicit_cast<char_const*>(local_60);
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_80,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/google/protobuf/edition_unittest.pb.cc"
               ,0x6dbe,failure_msg);
    pLVar2 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_80);
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_69,pLVar2);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_80);
  }
  puVar3 = google::protobuf::internal::HasBits<1>::operator[]
                     ((HasBits<1> *)(absl_log_internal_check_op_result + 0x10),0);
  this = from;
  uVar1 = *puVar3;
  if ((uVar1 & 1) != 0) {
    sVar4 = _internal_my_string((TestExtensionOrderings1 *)absl_log_internal_check_op_result);
    local_a0 = (MessageLite *)sVar4._M_len;
    local_98 = sVar4._M_str;
    local_20 = local_a0;
    local_18 = local_98;
    local_28 = this;
    local_10 = &this->field_0;
    puVar3 = google::protobuf::internal::HasBits<1>::operator[]
                       (&(this->field_0)._impl_._has_bits_,0);
    *puVar3 = *puVar3 | 1;
    to_msg_local = local_20;
    local_30 = local_18;
    arena = google::protobuf::MessageLite::GetArena((MessageLite *)this);
    sVar4._M_str = local_30;
    sVar4._M_len = (size_t)to_msg_local;
    google::protobuf::internal::ArenaStringPtr::Set(&(this->field_0)._impl_.my_string_,sVar4,arena);
  }
  puVar3 = google::protobuf::internal::HasBits<1>::operator[](&(from->field_0)._impl_._has_bits_,0);
  *puVar3 = uVar1 | *puVar3;
  google::protobuf::internal::InternalMetadata::MergeFrom<google::protobuf::UnknownFieldSet>
            (&(from->super_Message).super_MessageLite._internal_metadata_,
             (InternalMetadata *)(absl_log_internal_check_op_result + 8));
  return;
}

Assistant:

void TestExtensionOrderings1::MergeImpl(::google::protobuf::MessageLite& to_msg, const ::google::protobuf::MessageLite& from_msg) {
  auto* const _this = static_cast<TestExtensionOrderings1*>(&to_msg);
  auto& from = static_cast<const TestExtensionOrderings1&>(from_msg);
  // @@protoc_insertion_point(class_specific_merge_from_start:edition_unittest.TestExtensionOrderings1)
  ABSL_DCHECK_NE(&from, _this);
  ::uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = from._impl_._has_bits_[0];
  if ((cached_has_bits & 0x00000001u) != 0) {
    _this->_internal_set_my_string(from._internal_my_string());
  }
  _this->_impl_._has_bits_[0] |= cached_has_bits;
  _this->_internal_metadata_.MergeFrom<::google::protobuf::UnknownFieldSet>(from._internal_metadata_);
}